

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  undefined1 (*pauVar2) [16];
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  uint uVar31;
  uint uVar32;
  parasail_result_t *ppVar33;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int64_t *ptr_06;
  long lVar34;
  uint uVar35;
  int iVar36;
  size_t len;
  __m128i *palVar37;
  long lVar38;
  void *pvVar39;
  void *pvVar40;
  char *pcVar41;
  undefined8 extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  uint uVar43;
  ulong uVar44;
  __m128i *palVar45;
  char *__format;
  ulong uVar46;
  long lVar47;
  long lVar48;
  ulong size;
  ulong uVar49;
  int iVar50;
  long lVar51;
  ulong uVar52;
  long lVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 extraout_XMM0 [16];
  __m128i alVar56;
  long lVar70;
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar57 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 auVar60 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 auVar61 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 auVar62 [16];
  undefined1 extraout_XMM0_05 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  longlong lVar71;
  undefined1 extraout_XMM0_06 [16];
  longlong lVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  longlong lVar80;
  undefined1 auVar79 [16];
  long lVar81;
  longlong lVar82;
  long lVar87;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  longlong lVar88;
  undefined1 auVar86 [16];
  longlong lVar89;
  longlong lVar90;
  __m128i_64_t B_2;
  longlong lVar92;
  undefined1 auVar91 [16];
  int64_t iVar93;
  __m128i_64_t B_1;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  __m128i_64_t B;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i alVar96;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_278 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined4 local_1f0;
  undefined4 uStack_1ec;
  long local_1d8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  long lStack_170;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ulong uStack_120;
  undefined8 uStack_90;
  __m128i_64_t h;
  longlong lVar42;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar41 = "profile";
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar41 = "profile->profile64.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar41 = "profile->matrix";
      }
      else {
        uVar35 = profile->s1Len;
        if ((int)uVar35 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar41 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar41 = "s2";
        }
        else {
          uVar49 = CONCAT44(0,s2Len);
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar41 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar41 = "open";
          }
          else {
            if (-1 < gap) {
              uVar43 = uVar35 - 1;
              size = (ulong)uVar35 + 1 >> 1;
              uVar7 = (ulong)uVar43 % size;
              pvVar5 = (profile->profile64).matches;
              pvVar6 = (profile->profile64).similar;
              iVar50 = -open;
              iVar36 = ppVar4->min;
              uVar44 = 0x8000000000000000 - (long)iVar36;
              if (iVar36 != iVar50 && SBORROW4(iVar36,iVar50) == iVar36 + open < 0) {
                uVar44 = (ulong)(uint)open | 0x8000000000000000;
              }
              iVar36 = ppVar4->max;
              ppVar33 = parasail_result_new_table3((uint)((ulong)uVar35 + 1) & 0x7ffffffe,s2Len);
              if (ppVar33 != (parasail_result_t *)0x0) {
                ppVar33->flag = ppVar33->flag | 0x2830401;
                b = parasail_memalign___m128i(0x10,size);
                b_00 = parasail_memalign___m128i(0x10,size);
                b_01 = parasail_memalign___m128i(0x10,size);
                b_02 = parasail_memalign___m128i(0x10,size);
                ptr = parasail_memalign___m128i(0x10,size);
                b_03 = parasail_memalign___m128i(0x10,size);
                b_04 = parasail_memalign___m128i(0x10,size);
                b_05 = parasail_memalign___m128i(0x10,size);
                ptr_00 = parasail_memalign___m128i(0x10,size);
                ptr_01 = parasail_memalign___m128i(0x10,size);
                ptr_02 = parasail_memalign___m128i(0x10,size);
                ptr_03 = parasail_memalign___m128i(0x10,size);
                ptr_04 = parasail_memalign___m128i(0x10,size);
                ptr_05 = parasail_memalign___m128i(0x10,size);
                local_308._8_8_ = local_308._0_8_;
                local_308._0_8_ = uVar49;
                ptr_06 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
                alVar96[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
                alVar96[1]._0_1_ = ptr_00 == (__m128i *)0x0;
                auVar54._0_8_ = -(ulong)(b == (__m128i *)0x0);
                auVar54._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
                auVar75._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
                auVar75._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
                auVar54 = packssdw(auVar54,auVar75);
                auVar73._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
                auVar73._8_8_ = -(ulong)(b_03 == (__m128i *)0x0);
                auVar77._0_8_ = -(ulong)(b_04 == (__m128i *)0x0);
                auVar77._8_8_ = -(ulong)(b_05 == (__m128i *)0x0);
                auVar73 = packssdw(auVar73,auVar77);
                auVar54 = packssdw(auVar54,auVar73);
                if (((((ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) &&
                      ptr_05 != (__m128i *)0x0) &&
                     ((ptr_01 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) &&
                     ptr_02 != (__m128i *)0x0)) && ptr_06 != (int64_t *)0x0) &&
                    ((((((((((((((((auVar54 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  && (auVar54 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                 (auVar54 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                && (auVar54 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                               (auVar54 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar54 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                             && (auVar54 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                            && (auVar54 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                           && (auVar54 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar54 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar54 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar54 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar54 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar54 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar54 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar54[0xf])) {
                  iVar30 = s2Len + -1;
                  uVar31 = 1 - (int)(uVar43 / size);
                  uVar52 = (ulong)(uint)gap;
                  lVar34 = uVar44 + 1;
                  local_148._0_8_ = 0x7ffffffffffffffe - (long)iVar36;
                  auVar83._8_4_ = (int)lVar34;
                  auVar83._0_8_ = lVar34;
                  auVar83._12_4_ = (int)((ulong)lVar34 >> 0x20);
                  auVar55._8_4_ = (int)local_148._0_8_;
                  auVar55._0_8_ = local_148._0_8_;
                  auVar55._12_4_ = (int)((ulong)local_148._0_8_ >> 0x20);
                  alVar96[0] = size;
                  len = local_148._0_8_;
                  parasail_memset___m128i(b_03,alVar96,local_148._0_8_);
                  c[1] = extraout_RDX_00;
                  c[0] = size;
                  parasail_memset___m128i(b_04,c,len);
                  c_00[1] = extraout_RDX_01;
                  c_00[0] = size;
                  parasail_memset___m128i(b_05,c_00,len);
                  c_01[1] = extraout_RDX_02;
                  c_01[0] = size;
                  parasail_memset___m128i(b,c_01,len);
                  c_02[1] = extraout_RDX_03;
                  c_02[0] = size;
                  parasail_memset___m128i(b_00,c_02,len);
                  c_03[1] = extraout_RDX_04;
                  c_03[0] = size;
                  parasail_memset___m128i(b_01,c_03,len);
                  c_04[1] = extraout_RDX_05;
                  c_04[0] = size;
                  parasail_memset___m128i(b_02,c_04,len);
                  lVar81 = -(ulong)(uint)open;
                  lVar87 = -(ulong)(uint)open;
                  uVar32 = (int)size - 1;
                  alVar56 = (__m128i)pmovsxbq(extraout_XMM0,0x101);
                  auVar74._8_4_ = 0xffffffff;
                  auVar74._0_8_ = 0xffffffffffffffff;
                  auVar74._12_4_ = 0xffffffff;
                  for (uVar35 = uVar32; -1 < (int)uVar35; uVar35 = uVar35 - 1) {
                    ptr_04[uVar35][0] = lVar81;
                    ptr_04[uVar35][1] = lVar87;
                    ptr_05[uVar35] = alVar56;
                    uStack_120 = (ulong)(uint)gap;
                    lVar81 = lVar81 - uVar52;
                    lVar87 = lVar87 - uStack_120;
                    lVar47 = alVar56[1];
                    alVar56[0] = alVar56[0] + 1;
                    alVar56[1] = lVar47 - auVar74._8_8_;
                  }
                  b_09[1] = (ulong)(uint)gap;
                  lVar87 = (long)iVar50;
                  lVar81 = lVar87;
                  for (uVar46 = 0; uVar46 != size; uVar46 = uVar46 + 1) {
                    lVar47 = lVar81;
                    for (lVar48 = 0; lVar48 != 2; lVar48 = lVar48 + 1) {
                      *(long *)((long)&h + lVar48 * 8) = lVar47;
                      lVar47 = lVar47 - size * b_09[1];
                    }
                    ptr[uVar46][0] = h.m[0];
                    ptr[uVar46][1] = h.m[1];
                    lVar81 = lVar81 - b_09[1];
                  }
                  *ptr_06 = 0;
                  for (uVar46 = 1; s2Len + 1 != uVar46; uVar46 = uVar46 + 1) {
                    ptr_06[uVar46] = lVar87;
                    lVar87 = lVar87 - b_09[1];
                  }
                  palVar37 = ptr + uVar32;
                  lVar81 = size * uVar49 * 4;
                  local_1d8 = 0;
                  b_09[1] = 0;
                  uStack_90 = auVar55._8_8_;
                  local_148._8_8_ = uStack_90;
                  lStack_170 = auVar83._8_8_;
                  local_138._8_8_ = lStack_170;
                  local_138._0_8_ = lVar34;
                  while (b_09[1] != uVar49) {
                    auVar94._8_4_ = (int)(*palVar37)[0];
                    auVar94._0_8_ = (*palVar37)[0];
                    auVar94._12_4_ = *(undefined4 *)((long)*palVar37 + 4);
                    lVar38 = (long)(ppVar4->mapper[(byte)s2[b_09[1]]] * (int)size) * 0x10;
                    pvVar39 = (void *)(lVar38 + (long)pvVar6);
                    auVar95._0_8_ = lVar34 - (*ptr_04)[0];
                    auVar95._8_8_ = lStack_170 - (*ptr_04)[1];
                    local_2d8 = (undefined1  [16])0x0;
                    lVar51 = 0;
                    local_2f8 = (undefined1  [16])0x0;
                    local_2e8 = (undefined1  [16])0x0;
                    pvVar40 = pvVar39;
                    uVar46 = b_09[1];
                    local_278._0_8_ = lVar34;
                    local_278._8_8_ = lStack_170;
                    lVar87 = 0;
                    lVar42 = b_03[uVar32][0];
                    lVar47 = 0;
                    lVar71 = b_04[uVar32][0];
                    iVar93 = ptr_06[b_09[1]];
                    local_1b8._8_8_ = auVar94._8_8_;
                    lVar48 = 0;
                    lVar92 = b_05[uVar32][0];
                    while( true ) {
                      uStack_120 = (ulong)(uint)gap;
                      if (size << 4 == lVar51) break;
                      plVar1 = (long *)((long)*ptr + lVar51);
                      lVar8 = *plVar1;
                      lVar9 = plVar1[1];
                      pauVar2 = (undefined1 (*) [16])((long)*b_03 + lVar51);
                      lVar14 = *(long *)*pauVar2;
                      lVar15 = *(long *)(*pauVar2 + 8);
                      auVar75 = *pauVar2;
                      pauVar2 = (undefined1 (*) [16])((long)*b_04 + lVar51);
                      lVar16 = *(long *)*pauVar2;
                      lVar17 = *(long *)(*pauVar2 + 8);
                      auVar77 = *pauVar2;
                      pauVar2 = (undefined1 (*) [16])((long)*b_05 + lVar51);
                      lVar18 = *(long *)*pauVar2;
                      lVar19 = *(long *)(*pauVar2 + 8);
                      auVar55 = *pauVar2;
                      plVar1 = (long *)((long)*b + lVar51);
                      auVar54 = *(undefined1 (*) [16])((long)*b_00 + lVar51);
                      auVar73 = *(undefined1 (*) [16])((long)*b_01 + lVar51);
                      auVar83 = *(undefined1 (*) [16])((long)*b_02 + lVar51);
                      lVar53 = lVar8 - (ulong)(uint)open;
                      lVar70 = lVar9 - (ulong)(uint)open;
                      local_228._0_8_ = *plVar1 - uVar52;
                      local_228._8_8_ = plVar1[1] - uStack_120;
                      plVar1 = (long *)((long)*ptr_04 + lVar51);
                      local_1c8._0_8_ = auVar95._0_8_ + *plVar1;
                      local_1c8._8_8_ = auVar95._8_8_ + plVar1[1];
                      plVar1 = (long *)((long)*ptr_05 + lVar51);
                      local_308._8_8_ = local_308._8_8_ + plVar1[1];
                      local_308._0_8_ = local_308._0_8_ + *plVar1;
                      plVar1 = (long *)((long)pvVar3 + lVar51 + lVar38);
                      local_1b8._0_8_ = iVar93 + *plVar1;
                      local_1b8._8_8_ = local_1b8._8_8_ + plVar1[1];
                      plVar1 = (long *)((long)pvVar5 + lVar51 + lVar38);
                      lVar10 = *plVar1;
                      lVar11 = plVar1[1];
                      plVar1 = (long *)((long)pvVar39 + lVar51);
                      lVar12 = *plVar1;
                      lVar13 = plVar1[1];
                      b_06[1] = (longlong)pvVar40;
                      b_06[0] = (longlong)b_04;
                      a[1] = (longlong)b_05;
                      a[0] = uVar46;
                      palVar45 = b_05;
                      alVar96 = _mm_cmpgt_epi64_rpl(a,b_06);
                      b_07[0] = alVar96[1];
                      auVar54 = pblendvb(auVar54,auVar75,extraout_XMM0_00);
                      auVar73 = pblendvb(auVar73,auVar77,extraout_XMM0_00);
                      auVar75 = pblendvb(auVar83,auVar55,extraout_XMM0_00);
                      auVar57._8_4_ = 0xffffffff;
                      auVar57._0_8_ = 0xffffffffffffffff;
                      auVar57._12_4_ = 0xffffffff;
                      b_07[1] = (longlong)pvVar40;
                      a_00[1] = (longlong)palVar45;
                      a_00[0] = uVar46;
                      alVar96 = _mm_cmpgt_epi64_rpl(a_00,b_07);
                      b_08[0] = alVar96[1];
                      auVar76._0_8_ = -(ulong)(local_278._0_8_ == local_1c8._0_8_);
                      auVar76._8_8_ = -(ulong)(local_278._8_8_ == local_1c8._8_8_);
                      auVar76 = extraout_XMM0_01 | auVar76;
                      auVar58._0_8_ = -(ulong)((long)local_1c8._0_8_ < (long)local_278._0_8_);
                      auVar58._8_8_ = -(ulong)((long)local_1c8._8_8_ < (long)local_278._8_8_);
                      auVar83 = blendvpd(local_1c8,local_278,auVar58);
                      local_2d8 = pblendvb(local_238,local_2d8,auVar76);
                      local_2f8 = pblendvb(local_248,local_2f8,auVar76);
                      local_2e8 = pblendvb(local_308,local_2e8,auVar76);
                      auVar22._8_8_ = lVar70;
                      auVar22._0_8_ = lVar53;
                      auVar59._0_8_ = -(ulong)((long)local_228._0_8_ < lVar53);
                      auVar59._8_8_ = -(ulong)((long)local_228._8_8_ < lVar70);
                      auVar77 = blendvpd(local_228,auVar22,auVar59);
                      b_08[1] = (longlong)pvVar40;
                      a_01[1] = (longlong)palVar45;
                      a_01[0] = uVar46;
                      _mm_cmpgt_epi64_rpl(a_01,b_08);
                      auVar60._0_8_ = -(ulong)((long)local_1b8._0_8_ < auVar77._0_8_);
                      auVar60._8_8_ = -(ulong)((long)local_1b8._8_8_ < auVar77._8_8_);
                      auVar95 = blendvpd(local_1b8,auVar77,auVar60);
                      auVar23._8_8_ = lVar42 + lVar11;
                      auVar23._0_8_ = lVar87 + lVar10;
                      local_238 = pblendvb(auVar23,auVar54,extraout_XMM0_02);
                      auVar24._8_8_ = lVar71 + lVar13;
                      auVar24._0_8_ = lVar47 + lVar12;
                      local_248 = pblendvb(auVar24,auVar73,extraout_XMM0_02);
                      auVar20._8_8_ = lVar92 + 1;
                      auVar20._0_8_ = lVar48 + 1;
                      auVar21._8_8_ = auVar75._8_8_ - auVar57._8_8_;
                      auVar21._0_8_ = auVar75._0_8_ + 1;
                      local_308 = pblendvb(auVar20,auVar21,extraout_XMM0_02);
                      *(undefined1 (*) [16])((long)*b + lVar51) = auVar77;
                      *(undefined1 (*) [16])((long)*b_00 + lVar51) = auVar54;
                      *(undefined1 (*) [16])((long)*b_01 + lVar51) = auVar73;
                      *(undefined1 (*) [16])((long)*b_02 + lVar51) = auVar21;
                      *(undefined1 (*) [16])((long)*ptr + lVar51) = local_1b8;
                      *(undefined1 (*) [16])((long)*b_03 + lVar51) = auVar23;
                      *(undefined1 (*) [16])((long)*b_04 + lVar51) = auVar24;
                      *(undefined1 (*) [16])((long)*b_05 + lVar51) = auVar20;
                      lVar51 = lVar51 + 0x10;
                      local_278._0_8_ = auVar83._0_8_;
                      local_278._8_8_ = auVar83._8_8_;
                      lVar87 = lVar14;
                      lVar42 = lVar15;
                      lVar47 = lVar16;
                      lVar71 = lVar17;
                      iVar93 = lVar8;
                      local_1b8._8_8_ = lVar9;
                      lVar48 = lVar18;
                      lVar92 = lVar19;
                    }
                    auVar84._8_4_ = auVar95._0_4_;
                    auVar84._0_8_ = auVar95._0_8_;
                    auVar84._12_4_ = auVar95._4_4_;
                    auVar25._8_8_ = 0;
                    auVar25._0_8_ = local_238._0_8_;
                    local_238 = auVar25 << 0x40;
                    auVar26._8_8_ = 0;
                    auVar26._0_8_ = local_248._0_8_;
                    local_248 = auVar26 << 0x40;
                    auVar91._8_8_ = 0;
                    auVar91._0_8_ = local_308._0_8_;
                    local_308 = auVar91 << 0x40;
                    local_328._0_8_ = ptr_06[b_09[1] + 1];
                    local_328._8_8_ = auVar84._8_8_;
                    b_09[1] = b_09[1] + 1;
                    lVar87 = (*ptr_04)[1];
                    local_318._8_8_ = (*ptr_04)[0] + local_328._0_8_;
                    alVar96 = *ptr_05;
                    b_09[0] = (longlong)b_04;
                    a_02[1] = (longlong)b_05;
                    a_02[0] = uVar46;
                    palVar45 = b_05;
                    alVar56 = _mm_cmpgt_epi64_rpl(a_02,b_09);
                    b_10[0] = alVar56[1];
                    auVar61._0_8_ = -(ulong)(local_318._8_8_ == local_278._0_8_);
                    auVar61._8_8_ = -(ulong)(lVar87 + local_328._8_8_ == local_278._8_8_);
                    if ((long)local_318._8_8_ < (long)local_278._0_8_) {
                      local_318._8_8_ = local_278._0_8_;
                    }
                    auVar61 = extraout_XMM0_03 | auVar61;
                    auVar54 = pblendvb(local_2d8,local_238,auVar61);
                    auVar73 = pblendvb(local_2f8,local_248,auVar61);
                    auVar75 = pblendvb(local_2e8,(undefined1  [16])alVar96,auVar61);
                    auVar27._8_8_ = 0;
                    auVar27._0_8_ = auVar54._0_8_;
                    local_2d8 = auVar27 << 0x40;
                    auVar28._8_8_ = 0;
                    auVar28._0_8_ = auVar73._0_8_;
                    local_2f8 = auVar28 << 0x40;
                    auVar29._8_8_ = 0;
                    auVar29._0_8_ = auVar75._0_8_;
                    local_2e8 = auVar29 << 0x40;
                    local_318._0_8_ = lVar34;
                    b_10[1] = local_278._0_8_;
                    a_03[1] = (longlong)palVar45;
                    a_03[0] = uVar46;
                    alVar96 = _mm_cmpgt_epi64_rpl(a_03,b_10);
                    lVar42 = alVar96[1];
                    auVar62._0_8_ = -(ulong)((long)local_328._0_8_ < lVar34);
                    auVar62._8_8_ = -(ulong)((long)local_328._8_8_ < (long)local_318._8_8_);
                    auVar75 = blendvpd(local_328,local_318,auVar62);
                    auVar77 = pblendvb(local_238,local_2d8,extraout_XMM0_04);
                    auVar73 = pblendvb(local_248,local_2f8,extraout_XMM0_04);
                    auVar54 = pblendvb(local_308,local_2e8,extraout_XMM0_04);
                    lVar87 = local_1d8;
                    for (lVar47 = 0; size << 4 != lVar47; lVar47 = lVar47 + 0x10) {
                      pauVar2 = (undefined1 (*) [16])((long)*ptr + lVar47);
                      lVar48 = *(long *)*pauVar2;
                      lVar38 = *(long *)(*pauVar2 + 8);
                      auVar74 = *pauVar2;
                      auVar83 = *(undefined1 (*) [16])((long)*b_03 + lVar47);
                      auVar55 = *(undefined1 (*) [16])((long)*b_04 + lVar47);
                      auVar26 = *(undefined1 (*) [16])((long)*b_05 + lVar47);
                      auVar94 = *(undefined1 (*) [16])((long)*b_00 + lVar47);
                      auVar95 = *(undefined1 (*) [16])((long)*b_01 + lVar47);
                      auVar25 = *(undefined1 (*) [16])((long)*b_02 + lVar47);
                      local_328._0_8_ = auVar75._0_8_ - (ulong)(uint)open;
                      local_328._8_8_ = auVar75._8_8_ - (ulong)(uint)open;
                      lVar51 = local_318._0_8_ - uVar52;
                      local_318._8_8_ = local_318._8_8_ - uStack_120;
                      local_318._0_8_ = lVar51;
                      b_11[1] = local_278._0_8_;
                      b_11[0] = lVar42;
                      a_04[1] = (longlong)palVar45;
                      a_04[0] = (longlong)b;
                      alVar96 = _mm_cmpgt_epi64_rpl(a_04,b_11);
                      lVar42 = alVar96[1];
                      local_2d8 = pblendvb(local_2d8,auVar77,extraout_XMM0_05);
                      local_2f8 = pblendvb(local_2f8,auVar73,extraout_XMM0_05);
                      auVar91 = pblendvb(local_2e8,auVar54,extraout_XMM0_05);
                      auVar63._0_8_ = -(ulong)(lVar51 < (long)local_328._0_8_);
                      auVar63._8_8_ = -(ulong)((long)local_318._8_8_ < (long)local_328._8_8_);
                      local_318 = blendvpd(local_318,local_328,auVar63);
                      auVar54 = *(undefined1 (*) [16])((long)*b + lVar47);
                      auVar64._0_8_ = -(ulong)(auVar54._0_8_ < lVar48);
                      auVar64._8_8_ = -(ulong)(auVar54._8_8_ < lVar38);
                      auVar54 = blendvpd(auVar54,auVar74,auVar64);
                      auVar78._0_8_ = -(ulong)(local_318._0_8_ < auVar54._0_8_);
                      auVar78._8_8_ = -(ulong)(local_318._8_8_ < auVar54._8_8_);
                      auVar75 = blendvpd(local_318,auVar54,auVar78);
                      auVar54 = blendvpd(local_2d8,auVar94,auVar78);
                      lVar51 = auVar75._0_8_;
                      auVar85._0_8_ = -(ulong)(lVar48 == lVar51);
                      lVar48 = auVar75._8_8_;
                      auVar85._8_8_ = -(ulong)(lVar38 == lVar48);
                      auVar77 = blendvpd(auVar54,auVar83,auVar85);
                      auVar54 = blendvpd(local_2f8,auVar95,auVar78);
                      auVar73 = blendvpd(auVar54,auVar55,auVar85);
                      local_2e8._0_8_ = auVar91._0_8_ + 1;
                      local_2e8._8_8_ = auVar91._8_8_ + 1;
                      auVar54 = blendvpd(local_2e8,auVar25,auVar78);
                      auVar54 = blendvpd(auVar54,auVar26,auVar85);
                      *(undefined1 (*) [16])((long)*ptr + lVar47) = auVar75;
                      *(undefined1 (*) [16])((long)*b_03 + lVar47) = auVar77;
                      *(undefined1 (*) [16])((long)*b_04 + lVar47) = auVar73;
                      *(undefined1 (*) [16])((long)*b_05 + lVar47) = auVar54;
                      auVar65._0_8_ = -(ulong)(local_148._0_8_ < lVar51);
                      auVar65._8_8_ = -(ulong)(local_148._8_8_ < lVar48);
                      local_148 = blendvpd(auVar75,local_148,auVar65);
                      auVar66._0_8_ = -(ulong)(lVar51 < local_138._0_8_);
                      auVar66._8_8_ = -(ulong)(lVar48 < local_138._8_8_);
                      auVar83 = blendvpd(auVar75,local_138,auVar66);
                      auVar67._0_8_ = -(ulong)(auVar77._0_8_ < auVar83._0_8_);
                      auVar67._8_8_ = -(ulong)(auVar77._8_8_ < auVar83._8_8_);
                      auVar83 = blendvpd(auVar77,auVar83,auVar67);
                      auVar68._0_8_ = -(ulong)(auVar73._0_8_ < auVar83._0_8_);
                      auVar68._8_8_ = -(ulong)(auVar73._8_8_ < auVar83._8_8_);
                      lVar48 = *((ppVar33->field_4).trace)->trace_del_table;
                      *(int *)(lVar48 + lVar87) = auVar75._0_4_;
                      *(int *)(lVar81 + lVar48 + lVar87) = auVar75._8_4_;
                      auVar83 = blendvpd(auVar73,auVar83,auVar68);
                      lVar48 = *(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 8);
                      *(int *)(lVar48 + lVar87) = auVar77._0_4_;
                      *(int *)(lVar81 + lVar48 + lVar87) = auVar77._8_4_;
                      auVar69._0_8_ = -(ulong)(auVar54._0_8_ < auVar83._0_8_);
                      auVar69._8_8_ = -(ulong)(auVar54._8_8_ < auVar83._8_8_);
                      lVar48 = *(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x10);
                      *(int *)(lVar48 + lVar87) = auVar73._0_4_;
                      *(int *)(lVar81 + lVar48 + lVar87) = auVar73._8_4_;
                      local_138 = blendvpd(auVar54,auVar83,auVar69);
                      lVar48 = *(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x18);
                      *(int *)(lVar48 + lVar87) = auVar54._0_4_;
                      *(int *)(lVar81 + lVar48 + lVar87) = auVar54._8_4_;
                      lVar87 = lVar87 + uVar49 * 4;
                      local_278._0_8_ = lVar81;
                    }
                    local_1d8 = local_1d8 + 4;
                  }
                  b_12[0] = (ulong)uVar31;
                  iVar36 = 0;
                  lVar42 = ptr[uVar7][0];
                  lVar71 = ptr[uVar7][1];
                  lVar92 = b_03[uVar7][0];
                  lVar80 = b_03[uVar7][1];
                  lVar72 = b_04[uVar7][0];
                  lVar88 = b_04[uVar7][1];
                  lVar82 = b_05[uVar7][0];
                  lVar90 = b_05[uVar7][1];
                  while (lVar89 = lVar82, lVar82 = lVar72, lVar72 = lVar92, lVar92 = lVar42,
                        iVar36 < (int)uVar31) {
                    lVar42 = 0;
                    lVar71 = lVar92;
                    lVar92 = 0;
                    lVar80 = lVar72;
                    lVar72 = 0;
                    lVar88 = lVar82;
                    lVar82 = 0;
                    lVar90 = lVar89;
                    iVar36 = 1;
                  }
                  local_1f0 = (undefined4)uVar44;
                  uStack_1ec = (undefined4)(uVar44 >> 0x20);
                  local_2d8._8_4_ = local_1f0;
                  local_2d8._0_8_ = uVar44;
                  local_2d8._12_4_ = uStack_1ec;
                  b_12[1] = 1;
                  a_05[1] = (longlong)b_05;
                  a_05[0] = (longlong)b;
                  _mm_cmpgt_epi64_rpl(a_05,b_12);
                  auVar86._0_8_ = -(ulong)((long)uVar44 < (long)local_148._0_8_);
                  auVar86._8_8_ = -(ulong)((long)local_2d8._8_8_ < (long)local_148._8_8_);
                  auVar79._8_4_ = 0xffffffff;
                  auVar79._0_8_ = 0xffffffffffffffff;
                  auVar79._12_4_ = 0xffffffff;
                  auVar54 = auVar79 ^ auVar86 | extraout_XMM0_06;
                  if ((((((((((((((((auVar54 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar54 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar54 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar54 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar54 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar54 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar54 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar54 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar54 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar54 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar54 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar54 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar54 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar54 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar54 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar54[0xf]) {
                    local_2e8._8_4_ = (undefined4)lVar71;
                    local_2f8._8_4_ = (undefined4)lVar80;
                    local_308._8_4_ = (undefined4)lVar88;
                    local_328._8_4_ = (undefined4)lVar90;
                  }
                  else {
                    *(byte *)&ppVar33->flag = (byte)ppVar33->flag | 0x40;
                    local_2e8._8_4_ = 0;
                    local_2f8._8_4_ = 0;
                    local_308._8_4_ = 0;
                    local_328._8_4_ = 0;
                    iVar30 = 0;
                    uVar43 = 0;
                  }
                  ppVar33->score = local_2e8._8_4_;
                  ppVar33->end_query = uVar43;
                  ppVar33->end_ref = iVar30;
                  ((ppVar33->field_4).stats)->matches = local_2f8._8_4_;
                  ((ppVar33->field_4).stats)->similar = local_308._8_4_;
                  ((ppVar33->field_4).stats)->length = local_328._8_4_;
                  parasail_free(ptr_06);
                  parasail_free(ptr_05);
                  parasail_free(ptr_04);
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(b_05);
                  parasail_free(b_04);
                  parasail_free(b_03);
                  parasail_free(ptr);
                  parasail_free(b_02);
                  parasail_free(b_01);
                  parasail_free(b_00);
                  parasail_free(b);
                  return ppVar33;
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar41 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_stats_table_scan_profile_sse41_128_64",pcVar41);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile64.score;
    pvPm = (__m128i*)profile->profile64.matches;
    pvPs = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            vGapperL = _mm_add_epi64(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHpM = _mm_slli_si128(vHpM, 8);
        vHpS = _mm_slli_si128(vHpS, 8);
        vHpL = _mm_slli_si128(vHpL, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi64(vH, vGapO);
            vE_ext = _mm_sub_epi64(vE, vGapE);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vGapper = _mm_add_epi64(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vF, vGapper),
                    _mm_cmpeq_epi64(vF, vGapper));
            vF = _mm_max_epi64_rpl(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi64(vHp, vW);
            vHpM = _mm_add_epi64(vHpM, vWM);
            vHpS = _mm_add_epi64(vHpS, vWS);
            vHpL = _mm_add_epi64(vHpL, vOne);
            case1 = _mm_cmpgt_epi64_rpl(vE, vHp);
            vHt = _mm_max_epi64_rpl(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHtM = _mm_slli_si128(vHtM, 8);
        vHtS = _mm_slli_si128(vHtS, 8);
        vHtL = _mm_slli_si128(vHtL, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi64(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi64_rpl(vGapper, vF),
                _mm_cmpeq_epi64(vGapper, vF));
        vF = _mm_max_epi64_rpl(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            __m128i vFtM = _mm_slli_si128(vFM, 8);
            __m128i vFtS = _mm_slli_si128(vFS, 8);
            __m128i vFtL = _mm_slli_si128(vFL, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vFt, vF),
                    _mm_cmpeq_epi64(vFt, vF));
            vF = _mm_max_epi64_rpl(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vFM = _mm_slli_si128(vFM, 8);
        vFS = _mm_slli_si128(vFS, 8);
        vFL = _mm_slli_si128(vFL, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi64_rpl(vF, vHt);
        vH = _mm_max_epi64_rpl(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi64(vH, vGapO);
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vH = _mm_max_epi64_rpl(vHp, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            case1 = _mm_cmpeq_epi64(vH, vHp);
            case2 = _mm_cmpeq_epi64(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
            vHM = _mm_slli_si128(vHM, 8);
            vHS = _mm_slli_si128(vHS, 8);
            vHL = _mm_slli_si128(vHL, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}